

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExpandedCommandArgument.cxx
# Opt level: O3

void __thiscall
cmExpandedCommandArgument::cmExpandedCommandArgument
          (cmExpandedCommandArgument *this,string *value,bool quoted)

{
  pointer pcVar1;
  
  (this->Value)._M_dataplus._M_p = (pointer)&(this->Value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + value->_M_string_length);
  this->Quoted = quoted;
  return;
}

Assistant:

cmExpandedCommandArgument::cmExpandedCommandArgument(
  std::string const& value, bool quoted):
    Value(value), Quoted(quoted)
{

}